

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O0

DTDEntityDecl * __thiscall xercesc_4_0::DTDGrammar::getEntityDecl(DTDGrammar *this,XMLCh *entName)

{
  DTDEntityDecl *decl;
  XMLCh *entName_local;
  DTDGrammar *this_local;
  
  this_local = (DTDGrammar *)
               NameIdPool<xercesc_4_0::DTDEntityDecl>::getByKey(fDefaultEntities,entName);
  if ((DTDEntityDecl *)this_local == (DTDEntityDecl *)0x0) {
    this_local = (DTDGrammar *)
                 NameIdPool<xercesc_4_0::DTDEntityDecl>::getByKey(this->fEntityDeclPool,entName);
  }
  return (DTDEntityDecl *)this_local;
}

Assistant:

inline DTDEntityDecl* DTDGrammar::getEntityDecl(const XMLCh* const entName)
{
    DTDEntityDecl* decl = fDefaultEntities->getByKey(entName);

    if (!decl)
        return fEntityDeclPool->getByKey(entName);

    return decl;
}